

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> * __thiscall
duckdb::CSVSchema::GetTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,CSVSchema *this)

{
  pointer pCVar1;
  CSVColumnInfo *column;
  pointer pCVar2;
  
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (this->columns).
           super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
           super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->columns).
                super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&__return_storage_ptr__->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pCVar2->type);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalType> CSVSchema::GetTypes() const {
	vector<LogicalType> types;
	for (auto &column : columns) {
		types.push_back(column.type);
	}
	return types;
}